

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImFontGlyphRangesBuilder::BuildRanges
          (ImFontGlyphRangesBuilder *this,ImVector<unsigned_short> *out_ranges)

{
  bool bVar1;
  int n;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  uint7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  undefined4 local_14;
  
  for (local_14 = 0; local_14 < 0x10000; local_14 = local_14 + 1) {
    bVar1 = GetBit((ImFontGlyphRangesBuilder *)
                   CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
                   in_stack_ffffffffffffffcc);
    if (bVar1) {
      ImVector<unsigned_short>::push_back
                ((ImVector<unsigned_short> *)
                 CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
                 (unsigned_short *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      while( true ) {
        in_stack_ffffffffffffffd7 = false;
        if (local_14 < 0x10000) {
          in_stack_ffffffffffffffd7 =
               GetBit((ImFontGlyphRangesBuilder *)(ulong)in_stack_ffffffffffffffd0,
                      in_stack_ffffffffffffffcc);
        }
        if ((bool)in_stack_ffffffffffffffd7 == false) break;
        local_14 = local_14 + 1;
      }
      ImVector<unsigned_short>::push_back
                ((ImVector<unsigned_short> *)(ulong)in_stack_ffffffffffffffd0,
                 (unsigned_short *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    }
  }
  ImVector<unsigned_short>::push_back
            ((ImVector<unsigned_short> *)
             CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
             (unsigned_short *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  return;
}

Assistant:

void ImFontGlyphRangesBuilder::BuildRanges(ImVector<ImWchar>* out_ranges)
{
    for (int n = 0; n < 0x10000; n++)
        if (GetBit(n))
        {
            out_ranges->push_back((ImWchar)n);
            while (n < 0x10000 && GetBit(n + 1))
                n++;
            out_ranges->push_back((ImWchar)n);
        }
    out_ranges->push_back(0);
}